

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredElement
               (ParseNode *elem,RegSlot sourceLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ParseNodeVar *pPVar1;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot sourceLocation_local;
  ParseNode *elem_local;
  
  if (elem->nop - 0x51 < 3) {
    pPVar1 = ParseNode::AsParseNodeVar(elem);
    Symbol::SetNeedDeclaration(pPVar1->sym,false);
  }
  else {
    EmitReference(elem,byteCodeGenerator,funcInfo);
  }
  EmitAssignment((ParseNode *)0x0,elem,sourceLocation,byteCodeGenerator,funcInfo);
  FuncInfo::ReleaseReference(funcInfo,elem);
  return;
}

Assistant:

void EmitDestructuredElement(ParseNode *elem, Js::RegSlot sourceLocation, ByteCodeGenerator* byteCodeGenerator, FuncInfo *funcInfo)
{
    switch (elem->nop)
    {
    case knopVarDecl:
    case knopLetDecl:
    case knopConstDecl:
        // We manually need to set NeedDeclaration since the node won't be visited.
        elem->AsParseNodeVar()->sym->SetNeedDeclaration(false);
        break;

    default:
        EmitReference(elem, byteCodeGenerator, funcInfo);
    }

    EmitAssignment(nullptr, elem, sourceLocation, byteCodeGenerator, funcInfo);
    funcInfo->ReleaseReference(elem);
}